

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O2

Comment * soul::getComment(Comment *__return_storage_ptr__,Context *context)

{
  CodeLocation local_18;
  
  local_18.sourceCode.object = (context->location).sourceCode.object;
  if (local_18.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_18.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_18.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_18.location.data = (context->location).location.data;
  SourceCodeUtilities::findPrecedingComment(__return_storage_ptr__,&local_18);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_18.sourceCode);
  return __return_storage_ptr__;
}

Assistant:

static SourceCodeUtilities::Comment getComment (const AST::Context& context)
{
    return SourceCodeUtilities::findPrecedingComment (context.location);
}